

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_serpent.cpp
# Opt level: O0

int AF_A_SerpentChooseAttack
              (VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *this;
  DObject *this_00;
  AActor *pAVar1;
  bool bVar2;
  bool local_56;
  bool local_53;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_serpent.cpp"
                  ,0xaa,
                  "int AF_A_SerpentChooseAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar2) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_serpent.cpp"
                  ,0xaa,
                  "int AF_A_SerpentChooseAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  this = (AActor *)(param->field_0).field_1.a;
  local_53 = true;
  if (this != (AActor *)0x0) {
    local_53 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
  }
  if (local_53 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_serpent.cpp"
                  ,0xaa,
                  "int AF_A_SerpentChooseAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
    bVar2 = false;
    if ((param[1].field_0.field_3.Type == '\x03') &&
       (bVar2 = true, param[1].field_0.field_1.atag != 1)) {
      bVar2 = param[1].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar2) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_serpent.cpp"
                    ,0xaa,
                    "int AF_A_SerpentChooseAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)")
      ;
    }
    this_00 = (DObject *)param[1].field_0.field_1.a;
    local_56 = true;
    if (this_00 != (DObject *)0x0) {
      local_56 = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
    }
    if (local_56 == false) {
      __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_serpent.cpp"
                    ,0xaa,
                    "int AF_A_SerpentChooseAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)")
      ;
    }
  }
  if ((2 < numparam) && (param[2].field_0.field_3.Type != 0xff)) {
    bVar2 = false;
    if ((param[2].field_0.field_3.Type == '\x03') &&
       (bVar2 = true, param[2].field_0.field_1.atag != 8)) {
      bVar2 = param[2].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar2) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_serpent.cpp"
                    ,0xaa,
                    "int AF_A_SerpentChooseAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)")
      ;
    }
  }
  pAVar1 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->target);
  if (((pAVar1 != (AActor *)0x0) && (bVar2 = AActor::CheckMeleeRange(this), !bVar2)) &&
     (this->MissileState != (FState *)0x0)) {
    AActor::SetState(this,this->MissileState,false);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SerpentChooseAttack)
{
	PARAM_ACTION_PROLOGUE;

	if (!self->target || self->CheckMeleeRange())
	{
		return 0;
	}
	if (self->MissileState != NULL)
	{
		self->SetState (self->MissileState);
	}
	return 0;
}